

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_or_inplace(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  byte type1;
  ushort key;
  int *c1;
  container_t *c;
  ushort *puVar1;
  int *piVar2;
  uint uVar3;
  byte bVar4;
  ushort uVar5;
  int i;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  uint start_index;
  ulong uVar10;
  uint8_t type2;
  uint8_t result_type;
  uint8_t local_4e;
  uint8_t local_4d;
  uint local_4c;
  roaring_array_t *local_48;
  ulong local_40;
  uint local_34;
  
  local_4d = '\0';
  local_4c = (x2->high_low_container).size;
  if (local_4c == 0) {
    return;
  }
  uVar3 = (x1->high_low_container).size;
  local_40 = (ulong)uVar3;
  if (uVar3 == 0) {
    (x1->high_low_container).flags =
         (x1->high_low_container).flags & 0xfe | (x2->high_low_container).flags & 1;
    ra_overwrite(&x2->high_low_container,&x1->high_low_container,
                 (_Bool)((x2->high_low_container).flags & 1));
    return;
  }
  uVar5 = *(x1->high_low_container).keys;
  puVar1 = (x2->high_low_container).keys;
  iVar8 = uVar3 - 1;
  uVar10 = 0;
  lVar7 = 0;
  uVar3 = local_4c;
  local_48 = &x2->high_low_container;
LAB_0010605e:
  do {
    start_index = (uint)uVar10;
    key = *puVar1;
    uVar6 = (ulong)(int)lVar7;
    while( true ) {
      i = (int)uVar6;
      if (uVar5 == key) break;
      if (key <= uVar5) {
        local_4e = (x2->high_low_container).typecodes[uVar10 & 0xffff];
        c = get_copy_of_container
                      ((x2->high_low_container).containers[uVar10 & 0xffff],&local_4e,
                       (_Bool)((x2->high_low_container).flags & 1));
        if ((local_48->flags & 1) != 0) {
          local_48->containers[(int)start_index] = c;
          local_48->typecodes[(int)start_index] = local_4e;
        }
        ra_insert_new_key_value_at(&x1->high_low_container,i,key,c,local_4e);
        local_40 = (ulong)((int)local_40 + 1);
        uVar9 = start_index + 1;
        uVar10 = (ulong)uVar9;
        x2 = (roaring_bitmap_t *)local_48;
        uVar3 = local_4c;
        start_index = local_4c;
        if (uVar9 == local_4c) goto LAB_00106260;
        lVar7 = uVar6 + 1;
        puVar1 = (ushort *)((ulong)((uVar9 & 0xffff) * 2) + (long)local_48->keys);
        iVar8 = iVar8 + 1;
        goto LAB_0010605e;
      }
      if (iVar8 == i) goto LAB_00106267;
      uVar6 = uVar6 + 1;
      uVar5 = (x1->high_low_container).keys[uVar6 & 0xffff];
    }
    type1 = (x1->high_low_container).typecodes[uVar6 & 0xffff];
    c1 = (int *)(x1->high_low_container).containers[uVar6 & 0xffff];
    piVar2 = c1;
    bVar4 = type1;
    if (type1 == 4) {
      bVar4 = *(byte *)(c1 + 2);
      piVar2 = *(int **)c1;
    }
    if (bVar4 == 3) {
      if (((*piVar2 != 1) || (**(short **)(piVar2 + 2) != 0)) ||
         ((*(short **)(piVar2 + 2))[1] != -1)) goto LAB_00106178;
    }
    else if (*piVar2 != 0x10000) {
LAB_00106178:
      local_4e = (x2->high_low_container).typecodes[uVar10 & 0xffff];
      local_34 = (uint)type1;
      if (type1 == 4) {
        piVar2 = (int *)container_or(c1,'\x04',(x2->high_low_container).containers[uVar10 & 0xffff],
                                     local_4e,&local_4d);
      }
      else {
        piVar2 = (int *)container_ior(c1,type1,(x2->high_low_container).containers[uVar10 & 0xffff],
                                      local_4e,&local_4d);
      }
      if (piVar2 != c1) {
        container_free(c1,(uint8_t)local_34);
      }
      (x1->high_low_container).containers[uVar6] = piVar2;
      (x1->high_low_container).typecodes[uVar6] = local_4d;
      x2 = (roaring_bitmap_t *)local_48;
      uVar3 = local_4c;
    }
    start_index = start_index + 1;
    uVar10 = (ulong)start_index;
    if ((iVar8 == i) || (start_index == uVar3)) {
LAB_00106260:
      if (i + 1 != (int)local_40) {
        return;
      }
LAB_00106267:
      ra_append_copy_range
                (&x1->high_low_container,&x2->high_low_container,start_index,uVar3,
                 (_Bool)((x2->high_low_container).flags & 1));
      return;
    }
    lVar7 = uVar6 + 1;
    uVar5 = (x1->high_low_container).keys[(uint)lVar7 & 0xffff];
    puVar1 = (ushort *)((ulong)((start_index & 0xffff) * 2) + (long)(x2->high_low_container).keys);
  } while( true );
}

Assistant:

void roaring_bitmap_or_inplace(roaring_bitmap_t *x1,
                               const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    int length1 = x1->high_low_container.size;
    const int length2 = x2->high_low_container.size;

    if (0 == length2) return;

    if (0 == length1) {
        roaring_bitmap_overwrite(x1, x2);
        return;
    }
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            if (!container_is_full(c1, type1)) {
                container_t *c2 = ra_get_container_at_index(
                    &x2->high_low_container, (uint16_t)pos2, &type2);
                container_t *c =
                    (type1 == SHARED_CONTAINER_TYPE)
                        ? container_or(c1, type1, c2, type2, &result_type)
                        : container_ior(c1, type1, c2, type2, &result_type);

                if (c != c1) {  // in this instance a new container was created,
                                // and we need to free the old one
                    container_free(c1, type1);
                }
                ra_set_container_at_index(&x1->high_low_container, pos1, c,
                                          result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }

            // container_t *c2_clone = container_clone(c2, type2);
            ra_insert_new_key_value_at(&x1->high_low_container, pos1, s2, c2,
                                       type2);
            pos1++;
            length1++;
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&x1->high_low_container, &x2->high_low_container,
                             pos2, length2, is_cow(x2));
    }
}